

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int get_sway(DHANDLE dhandle)

{
  params_enumerate(dhandle,enum_params,(void *)0x0);
  response_send(dhandle,"Hello From GET sway_test!\n",0x1a);
  response_header_set(dhandle,"Content-Type","music");
  response_header_set(dhandle,"Content-Type","text/html");
  response_header_set(dhandle,"Dino-Type","Wine");
  return 200;
}

Assistant:

GET(sway) {
    PARAMS_ENUMERATE(enum_params, NULL);

    sway_test(DINO_VARS);

    RSP_HEADER_SET("Content-Type", "music");

    RSP_HEADER_SET("Content-Type", "text/html");

    RSP_HEADER_SET("Dino-Type", "Wine");

    return HTTP_ERROR_CODE_OK;
}